

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O0

ktx_uint32_t ktxTexture_GetRowPitch(ktxTexture *This,ktx_uint32_t level)

{
  long lVar1;
  uint uVar2;
  byte in_SIL;
  long in_RDI;
  ktx_uint32_t pitch;
  blockCount blockCount;
  ktxTexture_protected *prtctd;
  undefined4 local_24;
  
  lVar1 = *(long *)(in_RDI + 0x18);
  if (*(uint *)(in_RDI + 0x24) / *(uint *)(lVar1 + 0x24) >> (in_SIL & 0x1f) == 0) {
    local_24 = 1;
  }
  else {
    local_24 = *(uint *)(in_RDI + 0x24) / *(uint *)(lVar1 + 0x24) >> (in_SIL & 0x1f);
  }
  uVar2 = local_24 * *(int *)(lVar1 + 0x20) >> 3;
  padRow((ktx_uint32_t *)CONCAT44(local_24,uVar2));
  return uVar2;
}

Assistant:

ktx_uint32_t
 ktxTexture_GetRowPitch(ktxTexture* This, ktx_uint32_t level)
 {
    DECLARE_PROTECTED(ktxTexture)
    struct blockCount {
        ktx_uint32_t x;
    } blockCount;
    ktx_uint32_t pitch;

    blockCount.x = MAX(1, (This->baseWidth / prtctd->_formatSize.blockWidth)  >> level);
    pitch = blockCount.x * prtctd->_formatSize.blockSizeInBits / 8;
    (void)padRow(&pitch);

    return pitch;
 }